

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

QString * __thiscall VkSpecParser::parseName(QString *__return_storage_ptr__,VkSpecParser *this)

{
  char cVar1;
  bool bVar2;
  longlong extraout_RDX;
  long in_FS_OFFSET;
  QStringView QVar3;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QStringView local_78;
  QStringView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  while( true ) {
    cVar1 = QXmlStreamReader::atEnd();
    if (cVar1 != '\0') break;
    QXmlStreamReader::readNext();
    bVar2 = QXmlStreamReader::isEndElement(&this->m_reader);
    if (bVar2) {
      QVar3 = (QStringView)QXmlStreamReader::name();
      local_90.d = (Data *)0x0;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      local_90.ptr = L"name";
      local_90.size = 4;
      local_78.m_size = 4;
      local_78.m_data = L"name";
      local_68 = QVar3;
      bVar2 = comparesEqual(&local_68,&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      if (bVar2) break;
    }
    QXmlStreamReader::text();
    QString::append((QChar *)&local_58,extraout_RDX);
  }
  QString::trimmed_helper(__return_storage_ptr__);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VkSpecParser::parseName()
{
    QString name;
    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("name"))
            break;
        name += m_reader.text();
    }
    return name.trimmed();
}